

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O0

void __thiscall FIX::SocketInitiator::onDisconnect(SocketInitiator *this)

{
  socket_handle in_EDX;
  SocketConnector *in_RSI;
  
  onDisconnect((SocketInitiator *)&this[-1].m_settings.m_defaults,in_RSI,in_EDX);
  return;
}

Assistant:

void SocketInitiator::onDisconnect(SocketConnector &, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  SocketConnections::iterator j = m_pendingConnections.find(s);

  SocketConnection *pSocketConnection = 0;
  if (i != m_connections.end()) {
    pSocketConnection = i->second;
  }
  if (j != m_pendingConnections.end()) {
    pSocketConnection = j->second;
  }
  if (!pSocketConnection) {
    return;
  }

  setDisconnected(pSocketConnection->getSession()->getSessionID());

  Session *pSession = pSocketConnection->getSession();
  if (pSession) {
    pSession->disconnect();
    setDisconnected(pSession->getSessionID());
  }

  delete pSocketConnection;
  m_connections.erase(s);
  m_pendingConnections.erase(s);
}